

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qformlayout.cpp
# Opt level: O1

void __thiscall QFormLayoutPrivate::setupHorizontalLayoutData(QFormLayoutPrivate *this,int width)

{
  char cVar1;
  long lVar2;
  long lVar3;
  RowWrapPolicy RVar4;
  pointer ppQVar5;
  int iVar6;
  int *piVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  ulong uVar12;
  int iVar13;
  long lVar14;
  
  uVar12 = (this->m_matrix).m_storage.d.size;
  RVar4 = QFormLayout::rowWrapPolicy(*(QFormLayout **)&(this->super_QLayoutPrivate).field_0x8);
  uVar11 = (uint)(uVar12 >> 1);
  if ((int)uVar11 < 1) {
    iVar13 = 0;
  }
  else {
    uVar12 = (ulong)(uVar11 & 0x7fffffff);
    lVar14 = 0;
    iVar13 = 0;
    do {
      ppQVar5 = QList<QFormLayoutItem_*>::data(&(this->m_matrix).m_storage);
      lVar2 = *(long *)((long)ppQVar5 + lVar14);
      ppQVar5 = QList<QFormLayoutItem_*>::data(&(this->m_matrix).m_storage);
      lVar3 = *(long *)((long)ppQVar5 + lVar14 + 8);
      if (lVar2 != 0 || lVar3 != 0) {
        if (lVar2 != 0) {
          if ((lVar3 == 0) || (piVar7 = &this->maxLabelWidth, *(char *)(lVar2 + 0x2c) == '\0')) {
            piVar7 = (int *)(lVar2 + 0x14);
          }
          *(int *)(lVar2 + 0x38) = *piVar7;
          *(undefined4 *)(lVar2 + 0x34) = 0;
        }
        if (lVar3 != 0) {
          iVar6 = *(int *)(lVar3 + 0x24) + this->maxLabelWidth;
          iVar8 = width - iVar6;
          cVar1 = *(char *)(lVar3 + 0x2c);
          iVar9 = width;
          if (cVar1 != '\0') {
            iVar9 = iVar8;
          }
          iVar10 = 0;
          if (cVar1 != '\0') {
            iVar10 = iVar6;
          }
          if ((((RVar4 != WrapAllRows) && (cVar1 == '\0')) &&
              ((lVar2 != 0 || (iVar10 = 0, iVar9 = width, *(char *)(lVar3 + 8) == '\0')))) &&
             (iVar10 = iVar6, iVar9 = iVar8, iVar8 < *(int *)(lVar3 + 0x14))) {
            iVar10 = 0;
            iVar9 = width;
          }
          *(int *)(lVar3 + 0x38) = iVar9;
          *(int *)(lVar3 + 0x34) = iVar10;
          if (iVar13 <= *(int *)(lVar3 + 0x1c)) {
            iVar13 = *(int *)(lVar3 + 0x1c);
          }
        }
      }
      lVar14 = lVar14 + 0x10;
      uVar12 = uVar12 - 1;
    } while (uVar12 != 0);
  }
  this->formMaxWidth = iVar13 + this->maxLabelWidth;
  return;
}

Assistant:

void QFormLayoutPrivate::setupHorizontalLayoutData(int width)
{
    Q_Q(QFormLayout);

    // requires setupVerticalLayoutData to be called first

    int fieldMaxWidth = 0;

    int rr = m_matrix.rowCount();
    bool wrapAllRows = (q->rowWrapPolicy() == QFormLayout::WrapAllRows);

    for (int i = 0; i < rr; ++i) {
        QFormLayoutItem *label = m_matrix(i, 0);
        QFormLayoutItem *field = m_matrix(i, 1);

        // Totally ignore empty rows...
        if (!label && !field)
            continue;

        if (label) {
            // if there is a field, and we're side by side, we use maxLabelWidth
            // otherwise we just use the sizehint
            label->layoutWidth = (field && label->sideBySide) ? maxLabelWidth : label->sizeHint.width();
            label->layoutPos = 0;
        }

        if (field) {
            // This is the default amount allotted to fields in sbs
            int fldwidth = width - maxLabelWidth - field->sbsHSpace;

            // If we've split a row, we still decide to align
            // the field with all the other field if it will fit
            // Fields in sbs mode get the remnants of the maxLabelWidth
            if (!field->sideBySide) {
                if (wrapAllRows || (!label && field->fullRow) || field->sizeHint.width() > fldwidth) {
                    field->layoutWidth = width;
                    field->layoutPos = 0;
                } else {
                    field->layoutWidth = fldwidth;
                    field->layoutPos = width - fldwidth;
                }
            } else {
                // We're sbs, so we should have a label
                field->layoutWidth = fldwidth;
                field->layoutPos = width - fldwidth;
            }

            fieldMaxWidth = qMax(fieldMaxWidth, field->maxSize.width());
        }
    }

    formMaxWidth = maxLabelWidth + fieldMaxWidth;
}